

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_query.hpp
# Opt level: O0

size_t jessilib::
       value_end_action<char8_t,jessilib::HTMLFormContext<char8_t,std::vector<std::pair<std::basic_string_view<char8_t,std::char_traits<char8_t>>,std::basic_string_view<char8_t,std::char_traits<char8_t>>>,std::allocator<std::pair<std::basic_string_view<char8_t,std::char_traits<char8_t>>,std::basic_string_view<char8_t,std::char_traits<char8_t>>>>>>>
                 (HTMLFormContext<char8_t,_std::vector<std::pair<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::pair<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>_>_>
                  *inout_context,basic_string_view<char8_t,_std::char_traits<char8_t>_> *param_2)

{
  char8_t *pcVar1;
  char8_t *__str;
  char8_t *__str_00;
  vector<std::pair<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::pair<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>_>
  *inout_container;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> local_78;
  undefined1 local_68 [8];
  basic_string_view<char8_t,_std::char_traits<char8_t>_> key;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> value;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> key_1;
  char8_t *value_start;
  char8_t *key_start;
  char8_t *value_end;
  basic_string_view<char8_t,_std::char_traits<char8_t>_> *param_1_local;
  HTMLFormContext<char8_t,_std::vector<std::pair<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::pair<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>_>_>
  *inout_context_local;
  
  pcVar1 = inout_context->write_head;
  __str = inout_context->key_start;
  __str_00 = inout_context->value_start;
  if (__str_00 == (char8_t *)0x0) {
    std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::basic_string_view
              ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)local_68,__str,
               (long)pcVar1 - (long)__str);
    inout_container = inout_context->out_container;
    std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::basic_string_view(&local_78);
    container::
    push<std::vector<std::pair<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::pair<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_&,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_nullptr>
              (inout_container,(basic_string_view<char8_t,_std::char_traits<char8_t>_> *)local_68,
               &local_78);
    inout_context->key_start = pcVar1;
  }
  else {
    std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::basic_string_view
              ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)&value._M_str,__str,
               (long)__str_00 - (long)__str);
    std::basic_string_view<char8_t,_std::char_traits<char8_t>_>::basic_string_view
              ((basic_string_view<char8_t,_std::char_traits<char8_t>_> *)&key._M_str,__str_00,
               (long)pcVar1 - (long)__str_00);
    container::
    push<std::vector<std::pair<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>,_std::allocator<std::pair<std::basic_string_view<char8_t,_std::char_traits<char8_t>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_>_>_>,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_&,_std::basic_string_view<char8_t,_std::char_traits<char8_t>_>_&,_nullptr>
              (inout_context->out_container,
               (basic_string_view<char8_t,_std::char_traits<char8_t>_> *)&value._M_str,
               (basic_string_view<char8_t,_std::char_traits<char8_t>_> *)&key._M_str);
    inout_context->key_start = pcVar1;
    inout_context->value_start = (char8_t *)0x0;
  }
  return 0;
}

Assistant:

constexpr size_t value_end_action(ContextT& inout_context, std::basic_string_view<CharT>&) {
	const CharT* value_end = inout_context.write_head;
	const CharT* key_start = inout_context.key_start;
	const CharT* value_start = inout_context.value_start;
	if (value_start != nullptr) {
		// Terminate key & value, push them to table
		std::basic_string_view<CharT> key{ key_start, static_cast<size_t>(value_start - key_start) };
		std::basic_string_view<CharT> value{ value_start, static_cast<size_t>(value_end - value_start) };
		jessilib::container::push(inout_context.out_container, key, value);

		// Start reading next key
		inout_context.key_start = value_end;
		inout_context.value_start = nullptr;
		return 0;
	}

	// This is a valueless key; terminate the key and push it
	std::basic_string_view<CharT> key{ key_start, static_cast<size_t>(value_end - key_start) };
	jessilib::container::push(inout_context.out_container, key, std::basic_string_view<CharT>{});

	// Start reading next key
	inout_context.key_start = value_end;
	return 0;
}